

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O2

void sx__coro_invoke(sx_coro_context *ctx,sx_fiber_cb *callback,void *user)

{
  uint uVar1;
  int iVar2;
  sx_pool *psVar3;
  sx__pool_page *psVar4;
  sx__coro_state *psVar5;
  code *pcVar6;
  uint uVar7;
  _Bool _Var8;
  sx__pool_page *psVar9;
  ulong uVar10;
  sx__pool_page *psVar11;
  sx_fiber_t pvVar12;
  sx__pool_page **ppsVar13;
  uint32_t line;
  void ***__s;
  long lVar14;
  bool bVar15;
  
  psVar3 = ctx->coro_pool;
  ppsVar13 = &psVar3->pages;
  while (psVar9 = *ppsVar13, psVar9 != (sx__pool_page *)0x0) {
    ppsVar13 = &psVar9->next;
    if (0 < psVar9->iter) goto LAB_00109720;
  }
  uVar1 = psVar3->capacity;
  iVar2 = psVar3->item_sz;
  lVar14 = 0;
  psVar9 = (sx__pool_page *)
           (*ctx->alloc->alloc_cb)
                     ((void *)0x0,((long)iVar2 + 8) * (long)(int)uVar1 + 0x20,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      "void sx__coro_invoke(sx_coro_context *, sx_fiber_cb *, void *)",0xda,
                      ctx->alloc->user_data);
  if (psVar9 == (sx__pool_page *)0x0) {
    sx__mem_run_fail_callback
              ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h",
               0x3e);
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                      ,0x3e,"Out of memory");
    pcVar6 = (code *)swi(3);
    (*pcVar6)();
    return;
  }
  psVar9->iter = uVar1;
  psVar9->ptrs = &psVar9[1].ptrs;
  __s = &psVar9[1].ptrs + (int)uVar1;
  psVar9->buff = (uint8_t *)__s;
  psVar9->next = (sx__pool_page *)0x0;
  uVar10 = 0;
  uVar7 = uVar1;
  if (0 < (int)uVar1) {
    uVar10 = (ulong)uVar1;
  }
  while( true ) {
    bVar15 = uVar10 == 0;
    uVar10 = uVar10 - 1;
    if (bVar15) break;
    psVar9->ptrs[(int)(uVar7 - 1)] = (void *)((long)__s + lVar14);
    __s = (void ***)psVar9->buff;
    lVar14 = lVar14 + iVar2;
    uVar7 = uVar7 - 1;
  }
  memset(__s,0,(long)(int)(iVar2 * uVar1));
  psVar4 = psVar3->pages;
  do {
    psVar11 = psVar4;
    psVar4 = psVar11->next;
  } while (psVar4 != (sx__pool_page *)0x0);
  psVar11->next = psVar9;
LAB_00109720:
  psVar9 = ctx->coro_pool->pages;
  do {
    iVar2 = psVar9->iter;
    if (iVar2 != 0) {
      if (0 < iVar2) {
        psVar9->iter = iVar2 - 1U;
        psVar5 = (sx__coro_state *)psVar9->ptrs[iVar2 - 1U];
        if (psVar5 == (sx__coro_state *)0x0) {
          sx__mem_run_fail_callback
                    ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                     0xdc);
          line = 0xdc;
LAB_00109807:
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c"
                            ,line,"Out of memory");
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
        if (psVar5->init == false) {
          _Var8 = sx_fiber_stack_init(&psVar5->stack_mem,ctx->stack_sz);
          if (!_Var8) {
            sx__mem_run_fail_callback
                      ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                       0xe3);
            line = 0xe3;
            goto LAB_00109807;
          }
          psVar5->init = true;
        }
        pvVar12 = (sx_fiber_t)
                  make_fcontext((psVar5->stack_mem).sptr,(psVar5->stack_mem).ssize,callback);
        psVar5->fiber = pvVar12;
        psVar5->callback = callback;
        psVar5->user = user;
        if (ctx->run_list_last != (sx__coro_state *)0x0) {
          ctx->run_list_last->next = psVar5;
          psVar5->prev = ctx->run_list_last;
        }
        ctx->run_list_last = psVar5;
        if (ctx->run_list == (sx__coro_state *)0x0) {
          ctx->run_list = psVar5;
        }
        ctx->cur_coro = psVar5;
        pvVar12 = (sx_fiber_t)jump_fcontext(psVar5->fiber,user);
        psVar5->fiber = pvVar12;
        return;
      }
      break;
    }
    psVar9 = psVar9->next;
  } while (psVar9 != (sx__pool_page *)0x0);
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                    ,0x8f,"capacity is full");
  pcVar6 = (code *)swi(3);
  (*pcVar6)();
  return;
}

Assistant:

void sx__coro_invoke(sx_coro_context* ctx, sx_fiber_cb* callback, void* user)
{
    sx__coro_state* fs = sx_pool_new_and_grow(ctx->coro_pool, ctx->alloc);
    if (!fs) {
        sx_out_of_memory();
        return;
    }

    // Initialize stack memory if not initilized
    if (!fs->init) {
        if (!sx_fiber_stack_init(&fs->stack_mem, ctx->stack_sz)) {
            sx_out_of_memory();
            return;
        }
        fs->init = true;
    }

    fs->fiber = sx_fiber_create(fs->stack_mem, callback);
    fs->callback = callback;
    fs->user = user;
    // Add to the end of the list
    sx__coro_add_list(&ctx->run_list, &ctx->run_list_last, fs);

    ctx->cur_coro = fs;
    fs->fiber = sx_fiber_switch(fs->fiber, user).from;
}